

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int HashmapFindValue(jx9_hashmap *pMap,jx9_value *pNeedle,jx9_hashmap_node **ppNode,int bStrict)

{
  uint uVar1;
  jx9_vm *pjVar2;
  void *pvVar3;
  sxi32 iF1;
  sxi32 sVar4;
  uint iNest;
  sxu32 sVar5;
  jx9_hashmap_node *pjVar6;
  jx9_value *pSrc;
  anon_union_8_3_18420de5_for_x local_b8;
  undefined8 uStack_b0;
  jx9_vm *local_a8;
  jx9_vm *pjStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  anon_union_8_3_18420de5_for_x local_78;
  undefined8 uStack_70;
  jx9_vm *local_68;
  jx9_vm *pjStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_a8 = pMap->pVm;
  pjVar6 = pMap->pFirst;
  sVar5 = pMap->nEntry;
  local_78.rVal = 0.0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  uStack_70 = 0x20;
  local_b8.rVal = 0.0;
  local_98 = 0;
  uStack_90 = 0;
  local_88 = 0;
  uStack_80 = 0;
  uStack_b0 = 0x20;
  if (sVar5 != 0) {
    pjStack_a0 = local_a8;
    local_68 = local_a8;
    pjStack_60 = local_a8;
    do {
      pjVar2 = pjVar6->pMap->pVm;
      if ((pjVar6->nValIdx < (pjVar2->aMemObj).nUsed) &&
         (pvVar3 = (pjVar2->aMemObj).pBase, pvVar3 != (void *)0x0)) {
        pSrc = (jx9_value *)((long)pvVar3 + (ulong)(pjVar6->nValIdx * (pjVar2->aMemObj).eSize));
        uVar1 = pSrc->iFlags;
        iNest = pNeedle->iFlags;
        if (((iNest | uVar1) & 0x20) == 0) {
          jx9MemObjLoad(pSrc,(jx9_value *)&local_78);
          jx9MemObjLoad(pNeedle,(jx9_value *)&local_b8);
          sVar4 = jx9MemObjCmp((jx9_value *)&local_b8,(jx9_value *)&local_78,(int)ppNode,iNest);
          jx9MemObjRelease((jx9_value *)&local_78);
          jx9MemObjRelease((jx9_value *)&local_b8);
          if (sVar4 == 0) {
            return 0;
          }
        }
        else if (uVar1 == iNest) {
          return 0;
        }
      }
      pjVar6 = pjVar6->pPrev;
      sVar5 = sVar5 - 1;
    } while (sVar5 != 0);
  }
  return -6;
}

Assistant:

static int HashmapFindValue(
	jx9_hashmap *pMap,   /* Target hashmap */
	jx9_value *pNeedle,  /* Lookup key */
	jx9_hashmap_node **ppNode, /* OUT: target node on success  */
	int bStrict      /* TRUE for strict comparison */
	)
{
	jx9_hashmap_node *pEntry;
	jx9_value sVal, *pVal;
	jx9_value sNeedle;
	sxi32 rc;
	sxu32 n;
	/* Perform a linear search since we cannot sort the hashmap based on values */
	pEntry = pMap->pFirst;
	n = pMap->nEntry;
	jx9MemObjInit(pMap->pVm, &sVal);
	jx9MemObjInit(pMap->pVm, &sNeedle);
	for(;;){
		if( n < 1 ){
			break;
		}
		/* Extract node value */
		pVal = HashmapExtractNodeValue(pEntry);
		if( pVal ){
			if( (pVal->iFlags|pNeedle->iFlags) & MEMOBJ_NULL ){
				sxi32 iF1 = pVal->iFlags;
				sxi32 iF2 = pNeedle->iFlags;
				if( iF1 == iF2 ){
					/* NULL values are equals */
					if( ppNode ){
						*ppNode = pEntry;
					}
					return SXRET_OK;
				}
			}else{
				/* Duplicate value */
				jx9MemObjLoad(pVal, &sVal);
				jx9MemObjLoad(pNeedle, &sNeedle);
				rc = jx9MemObjCmp(&sNeedle, &sVal, bStrict, 0);
				jx9MemObjRelease(&sVal);
				jx9MemObjRelease(&sNeedle);
				if( rc == 0 ){
					if( ppNode ){
						*ppNode = pEntry;
					}
					/* Match found*/
					return SXRET_OK;
				}
			}
		}
		/* Point to the next entry */
		pEntry = pEntry->pPrev; /* Reverse link */
		n--;
	}
	/* No such entry */
	return SXERR_NOTFOUND;
}